

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

int Ivy_FraigCountPairsClasses(Ivy_FraigMan_t *p)

{
  int nNodes;
  int nPairs;
  Ivy_Obj_t *pNode;
  Ivy_Obj_t *pClass;
  Ivy_FraigMan_t *p_local;
  
  return 0;
}

Assistant:

int Ivy_FraigCountPairsClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pClass, * pNode;
    int nPairs = 0, nNodes;
    return nPairs;

    Ivy_FraigForEachEquivClass( p->lClasses.pHead, pClass )
    {
        nNodes = 0;
        Ivy_FraigForEachClassNode( pClass, pNode )
            nNodes++;
        nPairs += nNodes * (nNodes - 1) / 2;
    }
    return nPairs;
}